

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_set_align_text(ps_decoder_t *ps,char *text)

{
  logmath_t *lmath;
  uint uVar1;
  s3wid_t sVar2;
  int wid;
  char *pcVar3;
  fsg_model_t *fsg;
  long ln;
  int iVar4;
  double dVar5;
  char delimfound;
  char *word;
  char *local_38;
  
  pcVar3 = __ckd_salloc__(text,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                          ,0x2ac);
  pcVar3 = string_trim(pcVar3,STRING_BOTH);
  iVar4 = 1;
  local_38 = pcVar3;
  while( true ) {
    uVar1 = nextword(pcVar3," \t\n\r",&word,&delimfound);
    if ((int)uVar1 < 0) break;
    sVar2 = dict_wordid(ps->dict,word);
    if (sVar2 == -1) {
      ln = 0x2b7;
      goto LAB_0010cbd8;
    }
    pcVar3 = word + uVar1;
    word[uVar1] = delimfound;
    iVar4 = iVar4 + 1;
  }
  lmath = ps->lmath;
  dVar5 = ps_config_float(ps->config,"lw");
  fsg = fsg_model_init("_align",lmath,(float32)(float)dVar5,iVar4);
  pcVar3 = local_38;
  iVar4 = 0;
LAB_0010caf5:
  uVar1 = nextword(pcVar3," \t\n\r",&word,&delimfound);
  if (-1 < (int)uVar1) {
    sVar2 = dict_wordid(ps->dict,word);
    if (sVar2 != -1) goto code_r0x0010cb2c;
    ln = 0x2c8;
LAB_0010cbd8:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,ln,"Unknown word %s\n");
    ckd_free(local_38);
    goto LAB_0010cbe9;
  }
  ckd_free(local_38);
  fsg->start_state = 0;
  fsg->final_state = iVar4;
  iVar4 = ps_add_fsg(ps,"_align",fsg);
  fsg_model_free(fsg);
  if (iVar4 < 0) {
LAB_0010cbe9:
    iVar4 = -1;
  }
  else {
    iVar4 = ps_activate_search(ps,"_align");
  }
  return iVar4;
code_r0x0010cb2c:
  wid = fsg_model_word_add(fsg,word);
  fsg_model_trans_add(fsg,iVar4,iVar4 + 1,0,wid);
  pcVar3 = word + uVar1;
  word[uVar1] = delimfound;
  iVar4 = iVar4 + 1;
  goto LAB_0010caf5;
}

Assistant:

int
ps_set_align_text(ps_decoder_t *ps, const char *text)
{
    fsg_model_t *fsg;
    char *textbuf = ckd_salloc(text);
    char *ptr, *word, delimfound;
    int n, nwords;

    textbuf = string_trim(textbuf, STRING_BOTH);
    /* First pass: count and verify words */
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    /* Second pass: make fsg */
    fsg = fsg_model_init("_align", ps->lmath,
                         ps_config_float(ps->config, "lw"),
                         nwords + 1);
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        wid = fsg_model_word_add(fsg, word);
        fsg_model_trans_add(fsg, nwords, nwords + 1, 0, wid);
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    ckd_free(textbuf);
    fsg->start_state = 0;
    fsg->final_state = nwords;
    if (ps_add_fsg(ps, PS_DEFAULT_ALIGN_SEARCH, fsg) < 0) {
        fsg_model_free(fsg);
        return -1;
    }
    fsg_model_free(fsg);
    return ps_activate_search(ps, PS_DEFAULT_ALIGN_SEARCH);
}